

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall
despot::Parser::ComputeNumOfEntries
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *instance,vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents,
          NamedVar *child)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference __lhs;
  const_reference ppNVar4;
  int local_30;
  int local_2c;
  int i;
  int num_entries;
  NamedVar *child_local;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *instance_local;
  Parser *this_local;
  
  local_2c = 1;
  for (local_30 = 0;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(instance), (ulong)(long)local_30 < sVar3; local_30 = local_30 + 1) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](instance,(long)local_30);
    bVar1 = std::operator==(__lhs,"-");
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(instance);
      if ((ulong)(long)local_30 < sVar3 - 1) {
        ppNVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                            (parents,(long)local_30);
        iVar2 = Variable::Size(&(*ppNVar4)->super_Variable);
      }
      else {
        iVar2 = Variable::Size(&child->super_Variable);
      }
      local_2c = iVar2 * local_2c;
    }
  }
  return local_2c;
}

Assistant:

int Parser::ComputeNumOfEntries(const vector<string>& instance,
	const vector<NamedVar*>& parents, const NamedVar* child) const {
	int num_entries = 1;
	for (int i = 0; i < instance.size(); i++) {
		if (instance[i] == "-") {
			if (i < instance.size() - 1)
				num_entries *= parents[i]->Size();
			else
				num_entries *= child->Size();
		}
	}
	return num_entries;
}